

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_resolve_merge_key_populate(fy_document *fyd,fy_node *fyn,fy_node_pair *fynp,fy_node *fynm)

{
  undefined1 *puVar1;
  list_head *plVar2;
  fy_token *pfVar3;
  fy_node_pair *pfVar4;
  list_head *value;
  fy_node *pfVar5;
  int iVar6;
  fy_token *pfVar7;
  char *fmt;
  
  if (((fyn->field_0x34 & 3) == 2) && ((fynm->field_0x34 & 3) == 2)) {
    pfVar7 = (fynm->field_12).scalar;
    iVar6 = 0;
    if (pfVar7 != (fy_token *)0x0 && pfVar7 != (fy_token *)&fynm->field_12) {
      do {
        pfVar4 = fy_node_mapping_lookup_pair(fyn,*(fy_node **)&pfVar7->type);
        if (pfVar4 == (fy_node_pair *)0x0) {
          value = (list_head *)malloc(0x30);
          if (value == (list_head *)0x0) {
            value = (list_head *)0x0;
          }
          else {
            value[1].next = (list_head *)0x0;
            value[1].prev = (list_head *)0x0;
            value[2].next = &fyd->node;
          }
          if (value == (list_head *)0x0) {
            fmt = "fy_node_pair_alloc() failed";
            iVar6 = 0x9fd;
            goto LAB_001259c7;
          }
          if (fyd == (fy_document *)0x0) {
LAB_00125930:
            pfVar5 = (fy_node *)0x0;
          }
          else {
            pfVar5 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar7->type,(fy_node *)0x0);
            if (pfVar5 == (fy_node *)0x0) {
              puVar1 = &fyd->diag->field_0x3c;
              *puVar1 = *puVar1 & 0xfe;
              goto LAB_00125930;
            }
          }
          value[1].next = &pfVar5->node;
          if (fyd == (fy_document *)0x0) {
LAB_00125956:
            pfVar5 = (fy_node *)0x0;
          }
          else {
            pfVar5 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar7->analyze_flags,(fy_node *)0x0);
            if (pfVar5 == (fy_node *)0x0) {
              puVar1 = &fyd->diag->field_0x3c;
              *puVar1 = *puVar1 & 0xfe;
              goto LAB_00125956;
            }
          }
          value[1].prev = &pfVar5->node;
          plVar2 = (fynp->node).next;
          plVar2->prev = value;
          value->next = plVar2;
          value->prev = &fynp->node;
          (fynp->node).next = value;
          if (fyn->xl != (fy_accel *)0x0) {
            fy_accel_insert(fyn->xl,value[1].next,value);
          }
        }
        pfVar3 = (fy_token *)(pfVar7->node).next;
        iVar6 = 0;
        pfVar7 = (fy_token *)0x0;
        if (pfVar3 != (fy_token *)&fynm->field_12) {
          pfVar7 = pfVar3;
        }
      } while (pfVar7 != (fy_token *)0x0);
    }
  }
  else {
    fmt = "bad inputs to %s";
    iVar6 = 0x9f2;
LAB_001259c7:
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,iVar6,"fy_resolve_merge_key_populate",fmt);
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int fy_resolve_merge_key_populate(struct fy_document *fyd, struct fy_node *fyn,
                                         struct fy_node_pair *fynp, struct fy_node *fynm) {
    struct fy_node_pair *fynpi, *fynpn;

    if (!fyd)
        return -1;

    fyd_error_check(fyd,
                    fyn && fynp && fynm && fyn->type == FYNT_MAPPING && fynm->type == FYNT_MAPPING,
                    err_out, "bad inputs to %s", __func__);

    for (fynpi = fy_node_pair_list_head(&fynm->mapping); fynpi;
         fynpi = fy_node_pair_next(&fynm->mapping, fynpi)) {

        /* make sure we don't override an already existing key */
        if (fy_node_mapping_key_is_duplicate(fyn, fynpi->key))
            continue;

        fynpn = fy_node_pair_alloc(fyd);
        fyd_error_check(fyd, fynpn, err_out,
                        "fy_node_pair_alloc() failed");

        fynpn->key = fy_node_copy(fyd, fynpi->key);
        fynpn->value = fy_node_copy(fyd, fynpi->value);

        fy_node_pair_list_insert_after(&fyn->mapping, fynp, fynpn);
        if (fyn->xl)
            fy_accel_insert(fyn->xl, fynpn->key, fynpn);
    }

    return 0;

    err_out:
    return -1;
}